

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void zng_tr_flush_block(deflate_state *s,char *buf,uint32_t stored_len,int last)

{
  ushort uVar1;
  int max_code;
  unsigned_long uVar2;
  long lVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ct_data *tree;
  uint uVar10;
  ct_data *tree_00;
  uint64_t val;
  ulong uVar11;
  uint uVar12;
  
  if (s->sym_next == 0) {
    s->static_len = 7;
    uVar7 = 0;
    uVar8 = 0;
    uVar12 = 0;
    goto LAB_0010adb8;
  }
  if (s->level < 1) {
    uVar7 = (ulong)(stored_len + 5);
    uVar12 = 0;
    uVar8 = uVar7;
    goto LAB_0010adb8;
  }
  if (s->strm->data_type == 2) {
    uVar7 = 0xf3ffc07f;
    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
      if (((uVar7 & 1) != 0) && (s->dyn_ltree[lVar9].fc.freq != 0)) goto LAB_0010ace9;
      uVar7 = uVar7 >> 1;
    }
    iVar6 = 1;
    if (((s->dyn_ltree[9].fc.freq == 0) && (s->dyn_ltree[10].fc.freq == 0)) &&
       (s->dyn_ltree[0xd].fc.freq == 0)) {
      lVar9 = 0;
      do {
        if (lVar9 == 0xe0) goto LAB_0010ace9;
        lVar3 = lVar9 + 0x20;
        lVar9 = lVar9 + 1;
      } while (s->dyn_ltree[lVar3].fc.freq == 0);
    }
    goto LAB_0010aceb;
  }
  goto LAB_0010acee;
LAB_0010ace9:
  iVar6 = 0;
LAB_0010aceb:
  s->strm->data_type = iVar6;
LAB_0010acee:
  build_tree(s,&s->l_desc);
  build_tree(s,&s->d_desc);
  scan_tree(s,s->dyn_ltree,(s->l_desc).max_code);
  scan_tree(s,s->dyn_dtree,(s->d_desc).max_code);
  build_tree(s,&s->bl_desc);
  uVar4 = 0x12;
  while ((uVar12 = 2, 2 < uVar4 && (uVar12 = uVar4, s->bl_tree["\x10\x11\x12"[uVar4]].dl.dad == 0)))
  {
    uVar4 = uVar4 - 1;
  }
  uVar2 = s->opt_len;
  s->opt_len = uVar2 + (long)(int)uVar12 * 3 + 0x11;
  uVar7 = (long)(int)uVar12 * 3 + uVar2 + 0x1b >> 3;
  uVar8 = s->static_len + 10 >> 3;
  if ((uVar8 <= uVar7) || (s->strategy == 4)) {
    uVar7 = uVar8;
  }
LAB_0010adb8:
  if ((buf == (char *)0x0) || (uVar7 < stored_len + 4)) {
    if (uVar8 == uVar7) {
      zng_tr_emit_tree(s,1,last);
      tree_00 = static_ltree;
      tree = static_dtree;
    }
    else {
      zng_tr_emit_tree(s,2,last);
      iVar6 = (s->l_desc).max_code;
      max_code = (s->d_desc).max_code;
      uVar11 = (ulong)max_code;
      uVar10 = s->bi_valid;
      uVar8 = s->bi_buf;
      uVar7 = (long)iVar6 - 0x100;
      uVar4 = uVar10 + 5;
      bVar5 = (byte)uVar10;
      if ((uVar4 | uVar10) < 0x40) {
        uVar7 = uVar7 << (bVar5 & 0x3f) | uVar8;
      }
      else if (uVar10 < 0x40) {
        *(ulong *)(s->pending_buf + s->pending) = uVar7 << (bVar5 & 0x3f) | uVar8;
        s->pending = s->pending + 8;
        uVar7 = uVar7 >> (-bVar5 & 0x3f);
        uVar4 = uVar10 - 0x3b;
      }
      else {
        uVar4 = 5;
        *(ulong *)(s->pending_buf + s->pending) = uVar8;
        s->pending = s->pending + 8;
      }
      uVar10 = uVar4 + 5;
      bVar5 = (byte)uVar4;
      if ((uVar10 | uVar4) < 0x40) {
        uVar11 = uVar11 << (bVar5 & 0x3f) | uVar7;
      }
      else if (uVar4 < 0x40) {
        *(ulong *)(s->pending_buf + s->pending) = uVar11 << (bVar5 & 0x3f) | uVar7;
        s->pending = s->pending + 8;
        uVar11 = uVar11 >> (-bVar5 & 0x3f);
        uVar10 = uVar4 - 0x3b;
      }
      else {
        *(ulong *)(s->pending_buf + s->pending) = uVar7;
        s->pending = s->pending + 8;
        uVar10 = 5;
      }
      uVar7 = (long)(int)uVar12 - 3;
      uVar4 = uVar10 + 4;
      bVar5 = (byte)uVar10;
      if ((uVar4 | uVar10) < 0x40) {
        uVar7 = uVar7 << (bVar5 & 0x3f) | uVar11;
      }
      else if (uVar10 < 0x40) {
        *(ulong *)(s->pending_buf + s->pending) = uVar7 << (bVar5 & 0x3f) | uVar11;
        s->pending = s->pending + 8;
        uVar7 = uVar7 >> (-bVar5 & 0x3f);
        uVar4 = uVar10 - 0x3c;
      }
      else {
        *(ulong *)(s->pending_buf + s->pending) = uVar11;
        s->pending = s->pending + 8;
        uVar4 = 4;
      }
      uVar10 = 0xffffffff;
      if (-1 < (int)uVar12) {
        uVar10 = uVar12;
      }
      for (uVar8 = 0; uVar10 + 1 != uVar8; uVar8 = uVar8 + 1) {
        uVar1 = s->bl_tree["\x10\x11\x12"[uVar8]].dl.dad;
        uVar11 = (ulong)uVar1;
        uVar12 = uVar4 + 3;
        bVar5 = (byte)uVar4;
        if ((uVar12 | uVar4) < 0x40) {
          uVar7 = uVar11 << (bVar5 & 0x3f) | uVar7;
        }
        else if (uVar4 < 0x40) {
          *(ulong *)(s->pending_buf + s->pending) = uVar11 << (bVar5 & 0x3f) | uVar7;
          s->pending = s->pending + 8;
          uVar12 = uVar4 - 0x3d;
          uVar7 = (ulong)(uVar1 >> (-bVar5 & 0x3f));
        }
        else {
          *(ulong *)(s->pending_buf + s->pending) = uVar7;
          s->pending = s->pending + 8;
          uVar12 = 3;
          uVar7 = uVar11;
        }
        uVar4 = uVar12;
      }
      s->bi_buf = uVar7;
      s->bi_valid = uVar4;
      tree_00 = s->dyn_ltree;
      send_tree(s,tree_00,iVar6);
      tree = s->dyn_dtree;
      send_tree(s,tree,max_code);
    }
    compress_block(s,tree_00,tree);
  }
  else {
    zng_tr_stored_block(s,buf,stored_len,last);
  }
  init_block(s);
  if (last == 0) {
    return;
  }
  zng_tr_emit_align(s);
  return;
}

Assistant:

void Z_INTERNAL zng_tr_flush_block(deflate_state *s, char *buf, uint32_t stored_len, int last) {
    /* buf: input block, or NULL if too old */
    /* stored_len: length of input block */
    /* last: one if this is the last block for a file */
    unsigned long opt_lenb, static_lenb; /* opt_len and static_len in bytes */
    int max_blindex = 0;  /* index of last bit length code of non zero freq */

    /* Build the Huffman trees unless a stored block is forced */
    if (UNLIKELY(s->sym_next == 0)) {
        /* Emit an empty static tree block with no codes */
        opt_lenb = static_lenb = 0;
        s->static_len = 7;
    } else if (s->level > 0) {
        /* Check if the file is binary or text */
        if (s->strm->data_type == Z_UNKNOWN)
            s->strm->data_type = detect_data_type(s);

        /* Construct the literal and distance trees */
        build_tree(s, (tree_desc *)(&(s->l_desc)));
        Tracev((stderr, "\nlit data: dyn %lu, stat %lu", s->opt_len, s->static_len));

        build_tree(s, (tree_desc *)(&(s->d_desc)));
        Tracev((stderr, "\ndist data: dyn %lu, stat %lu", s->opt_len, s->static_len));
        /* At this point, opt_len and static_len are the total bit lengths of
         * the compressed block data, excluding the tree representations.
         */

        /* Build the bit length tree for the above two trees, and get the index
         * in bl_order of the last bit length code to send.
         */
        max_blindex = build_bl_tree(s);

        /* Determine the best encoding. Compute the block lengths in bytes. */
        opt_lenb = (s->opt_len+3+7) >> 3;
        static_lenb = (s->static_len+3+7) >> 3;

        Tracev((stderr, "\nopt %lu(%lu) stat %lu(%lu) stored %u lit %u ",
                opt_lenb, s->opt_len, static_lenb, s->static_len, stored_len,
                s->sym_next / 3));

        if (static_lenb <= opt_lenb || s->strategy == Z_FIXED)
            opt_lenb = static_lenb;

    } else {
        Assert(buf != NULL, "lost buf");
        opt_lenb = static_lenb = stored_len + 5; /* force a stored block */
    }

    if (stored_len+4 <= opt_lenb && buf != NULL) {
        /* 4: two words for the lengths
         * The test buf != NULL is only necessary if LIT_BUFSIZE > WSIZE.
         * Otherwise we can't have processed more than WSIZE input bytes since
         * the last block flush, because compression would have been
         * successful. If LIT_BUFSIZE <= WSIZE, it is never too late to
         * transform a block into a stored block.
         */
        zng_tr_stored_block(s, buf, stored_len, last);

    } else if (static_lenb == opt_lenb) {
        zng_tr_emit_tree(s, STATIC_TREES, last);
        compress_block(s, (const ct_data *)static_ltree, (const ct_data *)static_dtree);
        cmpr_bits_add(s, s->static_len);
    } else {
        zng_tr_emit_tree(s, DYN_TREES, last);
        send_all_trees(s, s->l_desc.max_code+1, s->d_desc.max_code+1, max_blindex+1);
        compress_block(s, (const ct_data *)s->dyn_ltree, (const ct_data *)s->dyn_dtree);
        cmpr_bits_add(s, s->opt_len);
    }
    Assert(s->compressed_len == s->bits_sent, "bad compressed size");
    /* The above check is made mod 2^32, for files larger than 512 MB
     * and unsigned long implemented on 32 bits.
     */
    init_block(s);

    if (last) {
        zng_tr_emit_align(s);
    }
    Tracev((stderr, "\ncomprlen %lu(%lu) ", s->compressed_len>>3, s->compressed_len-7*last));
}